

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O2

void Ver_StreamReload(Ver_Stream_t *p)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  size_t __n;
  char *pcVar4;
  size_t __size;
  
  if (p->fStop != 0) {
    __assert_fail("!p->fStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x80,"void Ver_StreamReload(Ver_Stream_t *)");
  }
  pcVar2 = p->pBufferCur;
  if (p->pBufferStop < pcVar2) {
    if (pcVar2 < p->pBufferEnd) {
      __n = (size_t)((int)p->pBufferEnd - (int)pcVar2);
      memmove(p->pBuffer,pcVar2,__n);
      p->pBufferCur = p->pBuffer;
      lVar1 = p->nBufferSize - __n;
      lVar3 = p->nFileSize - p->nFileRead;
      if (lVar1 < lVar3) {
        lVar3 = lVar1;
      }
      __size = (size_t)(int)lVar3;
      fread(p->pBuffer + __n,__size,1,(FILE *)p->pFile);
      lVar3 = p->nFileRead + __size;
      p->nFileRead = lVar3;
      pcVar4 = p->pBuffer + __size + __n;
      p->pBufferEnd = pcVar4;
      pcVar2 = p->pBuffer + 0xf0000;
      if (lVar3 == p->nFileSize) {
        pcVar2 = pcVar4;
      }
      p->pBufferStop = pcVar2;
      return;
    }
    __assert_fail("p->pBufferCur < p->pBufferEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x82,"void Ver_StreamReload(Ver_Stream_t *)");
  }
  __assert_fail("p->pBufferCur > p->pBufferStop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                ,0x81,"void Ver_StreamReload(Ver_Stream_t *)");
}

Assistant:

void Ver_StreamReload( Ver_Stream_t * p )
{
    int nCharsUsed, nCharsToRead;
    int RetValue;
    assert( !p->fStop );
    assert( p->pBufferCur > p->pBufferStop );
    assert( p->pBufferCur < p->pBufferEnd );
    // figure out how many chars are still not processed
    nCharsUsed = p->pBufferEnd - p->pBufferCur;
    // move the remaining data to the beginning of the buffer
    memmove( p->pBuffer, p->pBufferCur, (size_t)nCharsUsed );
    p->pBufferCur = p->pBuffer;
    // determine how many chars we will read
    nCharsToRead = VER_MINIMUM( p->nBufferSize - nCharsUsed, p->nFileSize - p->nFileRead );
    // read the chars
    RetValue = fread( p->pBuffer + nCharsUsed, nCharsToRead, 1, p->pFile );
    p->nFileRead += nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsUsed + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + VER_BUFFER_SIZE - VER_OFFSET_SIZE;
}